

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tfidfinit.cpp
# Opt level: O0

void insertintohashmap(vector<int,_std::allocator<int>_> *qu,int offset,int d,int tsid,int len,
                      int start)

{
  int iVar1;
  reference pvVar2;
  reference this;
  reference pvVar3;
  long lVar4;
  mapped_type *this_00;
  double dVar5;
  int local_6c;
  undefined1 local_68 [4];
  int i_1;
  point f;
  double tmp_dis;
  int local_38;
  int j;
  int i;
  int s_pos;
  double distance;
  int window;
  int start_local;
  int len_local;
  int tsid_local;
  int d_local;
  int offset_local;
  vector<int,_std::allocator<int>_> *qu_local;
  
  iVar1 = len / PAA_DIMENSION[d];
  _i = 0.0;
  start_local = tsid;
  len_local = d;
  tsid_local = offset;
  _d_local = qu;
  for (local_38 = 0; local_38 < PAA_DIMENSION[len_local]; local_38 = local_38 + 1) {
    for (tmp_dis._4_4_ = 0; tmp_dis._4_4_ < iVar1; tmp_dis._4_4_ = tmp_dis._4_4_ + 1) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         (_d_local,(long)(tsid_local + local_38));
      dVar5 = paa2ts(*pvVar2);
      this = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](&data_x,(long)start_local);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         (this,(long)(start + offset * iVar1 + local_38 * iVar1 + tmp_dis._4_4_));
      f._24_8_ = dVar5 - *pvVar3;
      _i = (double)f._24_8_ * (double)f._24_8_ + _i;
    }
  }
  if (_i / (double)len <= bucket_w * bucket_w * (double)FUZZY) {
    point::point((point *)local_68);
    f.f.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._0_4_ = PAA_DIMENSION[len_local];
    for (local_6c = 0; local_6c < PAA_DIMENSION[len_local]; local_6c = local_6c + 1) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         (_d_local,(long)(tsid_local + local_6c));
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)local_68,pvVar2);
    }
    lVar4 = (long)len_local;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&label,(long)start_local);
    this_00 = std::
              map<point,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<point>,_std::allocator<std::pair<const_point,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
              ::operator[](tree[lVar4] + *pvVar2,(key_type *)local_68);
    std::set<int,_std::less<int>,_std::allocator<int>_>::insert(this_00,&start_local);
    point::~point((point *)local_68);
  }
  return;
}

Assistant:

void insertintohashmap(vector<int> &qu, int offset, int d, int tsid, int len, int start) {
    // PAA window
    int window = len / PAA_DIMENSION[d];
    double distance = 0;
    int s_pos = start + offset * window;
    for (int i = 0; i < PAA_DIMENSION[d]; ++i) {
        for (int j = 0; j < window; ++j) {
            double tmp_dis = paa2ts(qu[offset + i]) - data_x[tsid][s_pos + i * window + j];
            distance += tmp_dis * tmp_dis;
        }
    }
    distance /= len;
    if (distance > bucket_w * bucket_w * FUZZY) {
        return;
    }
    point f;
    f.d = PAA_DIMENSION[d];
    for (int i = 0; i < PAA_DIMENSION[d]; ++i) {
        f.f.push_back(qu[offset + i]);
    }
    tree[d][label[tsid]][f].insert(tsid);
}